

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O1

void __thiscall Assimp::STLExporter::WriteMeshBinary(STLExporter *this,aiMesh *m)

{
  uint uVar1;
  aiVector3D *paVar2;
  ulong uVar3;
  aiFace *paVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  char dummy [2];
  float vz;
  float vy;
  float nz;
  float ny;
  float nx;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  ulong local_38;
  
  if (m->mNumFaces != 0) {
    local_38 = 0;
    do {
      paVar4 = m->mFaces + local_38;
      paVar2 = m->mNormals;
      fVar6 = 0.0;
      fVar8 = 0.0;
      fVar7 = 0.0;
      if (paVar2 != (aiVector3D *)0x0) {
        if ((ulong)paVar4->mNumIndices != 0) {
          uVar3 = 0;
          do {
            uVar1 = paVar4->mIndices[uVar3];
            fVar7 = fVar7 + paVar2[uVar1].x;
            fVar8 = fVar8 + paVar2[uVar1].y;
            fVar6 = fVar6 + paVar2[uVar1].z;
            uVar3 = uVar3 + 1;
          } while (paVar4->mNumIndices != uVar3);
        }
        fVar5 = fVar6 * fVar6 + fVar7 * fVar7 + fVar8 * fVar8;
        if (fVar5 < 0.0) {
          local_58 = fVar8;
          local_54 = fVar7;
          local_50 = fVar6;
          fVar5 = sqrtf(fVar5);
          fVar6 = local_50;
          fVar7 = local_54;
          fVar8 = local_58;
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        fVar5 = 1.0 / fVar5;
        fVar7 = fVar7 * fVar5;
        fVar8 = fVar8 * fVar5;
        fVar6 = fVar6 * fVar5;
      }
      local_44 = fVar6;
      local_40 = fVar8;
      local_3c = fVar7;
      std::ostream::write((char *)this,(long)&local_3c);
      std::ostream::write((char *)this,(long)&local_40);
      std::ostream::write((char *)this,(long)&local_44);
      if (paVar4->mNumIndices != 0) {
        uVar3 = 0;
        do {
          paVar2 = m->mVertices;
          uVar1 = paVar4->mIndices[uVar3];
          local_5c = paVar2[uVar1].x;
          local_48 = paVar2[uVar1].y;
          local_4c = paVar2[uVar1].z;
          std::ostream::write((char *)this,(long)&local_5c);
          std::ostream::write((char *)this,(long)&local_48);
          std::ostream::write((char *)this,(long)&local_4c);
          uVar3 = uVar3 + 1;
        } while (uVar3 < paVar4->mNumIndices);
      }
      local_5c = (float)((uint)local_5c & 0xffff0000);
      std::ostream::write((char *)this,(long)&local_5c);
      local_38 = local_38 + 1;
    } while (local_38 < m->mNumFaces);
  }
  return;
}

Assistant:

void STLExporter::WriteMeshBinary(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.Normalize();
        }
        // STL binary files use 4-byte floats. This may possibly cause loss of precision
        // for clients using 8-byte doubles
        float nx = (float) nor.x;
        float ny = (float) nor.y;
        float nz = (float) nor.z;
        AI_SWAP4(nx); AI_SWAP4(ny); AI_SWAP4(nz);
        mOutput.write((char *)&nx, 4); mOutput.write((char *)&ny, 4); mOutput.write((char *)&nz, 4);
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            float vx = (float) v.x, vy = (float) v.y, vz = (float) v.z;
            AI_SWAP4(vx); AI_SWAP4(vy); AI_SWAP4(vz);
            mOutput.write((char *)&vx, 4); mOutput.write((char *)&vy, 4); mOutput.write((char *)&vz, 4);
        }
        char dummy[2] = {0};
        mOutput.write(dummy, 2);
    }
}